

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateResizeBilinearLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  string *__rhs;
  Result local_200;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string err;
  ResizeBilinearLayerParams *params;
  string local_128;
  Result local_108;
  allocator local_d9;
  string local_d8;
  Result local_b8;
  undefined4 local_8c;
  Result local_88;
  Result local_50;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    local_21 = 1;
    local_8c = 1;
    goto LAB_00a35091;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"ResizeBilinear",&local_d9);
    validateInputOutputRankEquality(&local_b8,pNVar1,&local_d8,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_b8);
    Result::~Result(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      local_21 = 1;
      local_8c = 1;
      goto LAB_00a35091;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,"ResizeBilinear",(allocator *)((long)&params + 7));
    validateRankCount(&local_108,pNVar1,&local_128,3,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_21 = 1;
      local_8c = 1;
      goto LAB_00a35091;
    }
  }
  err.field_2._8_8_ = Specification::NeuralNetworkLayer::resizebilinear(local_20);
  iVar3 = Specification::ResizeBilinearLayerParams::targetsize_size
                    ((ResizeBilinearLayerParams *)err.field_2._8_8_);
  if ((iVar3 == 0) ||
     (iVar3 = Specification::ResizeBilinearLayerParams::targetsize_size
                        ((ResizeBilinearLayerParams *)err.field_2._8_8_), iVar3 == 2)) {
    local_21 = 1;
    local_8c = 1;
  }
  else {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+(&local_1b8,"Target Size in the resize bilinear layer \'",__rhs);
    std::operator+(&local_198,&local_1b8,
                   "\' must be a vector of size 2 (i.e height, width) but is a vector of size ");
    iVar3 = Specification::ResizeBilinearLayerParams::targetsize_size
                      ((ResizeBilinearLayerParams *)err.field_2._8_8_);
    std::__cxx11::to_string(&local_1d8,iVar3);
    std::operator+(&local_178,&local_198,&local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178,".");
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    Result::Result(&local_200,INVALID_MODEL_PARAMETERS,(string *)local_158);
    Result::operator=(__return_storage_ptr__,&local_200);
    Result::~Result(&local_200);
    local_21 = 1;
    local_8c = 1;
    std::__cxx11::string::~string((string *)local_158);
  }
LAB_00a35091:
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateResizeBilinearLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "ResizeBilinear", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "ResizeBilinear", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.resizebilinear();
    // target Size must be 2D if provided
    if (!(params.targetsize_size() == 0 || params.targetsize_size() == 2)) {
        std::string err = "Target Size in the resize bilinear layer '" + layer.name() + "' must be a vector of size 2 (i.e height, width) but is a vector of size " + std::to_string(params.targetsize_size()) + ".";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}